

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_conversion_to_int_array_with_runoptimize(void)

{
  uint32_t *a2;
  roaring_bitmap_t *r;
  uint32_t *ans_00;
  uint32_t *arr;
  uint64_t card;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t *ans;
  int ans_ctr;
  roaring_bitmap_t *r1;
  undefined8 in_stack_ffffffffffffffc8;
  int line;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint len;
  uint uVar1;
  uint uVar2;
  int local_c;
  
  line = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  roaring_bitmap_create();
  local_c = 0;
  a2 = (uint32_t *)calloc(100000,4);
  for (uVar2 = 0; uVar2 < 50000; uVar2 = uVar2 + 1) {
    if (uVar2 != 30000) {
      a2[local_c] = uVar2;
      local_c = local_c + 1;
    }
  }
  for (uVar1 = 70000; uVar1 < 130000; uVar1 = uVar1 + 0x11) {
    a2[local_c] = uVar1;
    local_c = local_c + 1;
  }
  for (len = 0x30000; len < 0x40000; len = len + 1) {
    if (len % 3 != 0) {
      a2[local_c] = len;
      local_c = local_c + 1;
    }
  }
  roaring_bitmap_free((roaring_bitmap_t *)0x111a55);
  make_roaring_from_array((uint32_t *)CONCAT44(uVar2,uVar1),len);
  roaring_bitmap_run_optimize((roaring_bitmap_t *)CONCAT44(uVar2,uVar1));
  _assert_true(CONCAT44(uVar2,uVar1),(char *)CONCAT44(len,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,line);
  r = (roaring_bitmap_t *)roaring_bitmap_get_cardinality((roaring_bitmap_t *)CONCAT44(uVar2,uVar1));
  ans_00 = (uint32_t *)malloc((long)r << 2);
  roaring_bitmap_to_uint32_array(r,ans_00);
  array_equals(ans_00,(int32_t)r,a2,local_c);
  _assert_true(CONCAT44(uVar2,uVar1),(char *)CONCAT44(len,in_stack_ffffffffffffffd8),(char *)r,
               (int)((ulong)ans_00 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x111afe);
  free(ans_00);
  free(a2);
  return;
}

Assistant:

DEFINE_TEST(test_conversion_to_int_array_with_runoptimize) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    int ans_ctr = 0;
    uint32_t *ans = (uint32_t *)calloc(100000, sizeof(int32_t));

    // a dense bitmap container  (best done with runs)
    for (uint32_t i = 0; i < 50000; ++i) {
        if (i != 30000) {  // making 2 runs
            ans[ans_ctr++] = i;
        }
    }

    // a sparse one
    for (uint32_t i = 70000; i < 130000; i += 17) {
        ans[ans_ctr++] = i;
    }

    // a dense one but not good for runs

    for (uint32_t i = 65536 * 3; i < 65536 * 4; i++) {
        if (i % 3 != 0) {
            ans[ans_ctr++] = i;
        }
    }
    roaring_bitmap_free(r1);

    r1 = make_roaring_from_array(ans, ans_ctr);
    assert_true(roaring_bitmap_run_optimize(r1));

    uint64_t card = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr);

    assert_true(array_equals(arr, (int)card, ans, ans_ctr));
    roaring_bitmap_free(r1);
    free(arr);
    free(ans);
}